

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O1

void Hex::Hexdumper<char>::output_hex
               (ostream *os,char *first,char *last,char filler,int numberbase,bool showbase,
               bool uppercasehex)

{
  ostream *poVar1;
  remove_const_t<char> val;
  long lVar2;
  ostream oVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined3 in_register_00000089;
  char local_45;
  undefined4 local_44;
  remove_const_t<char> *local_40;
  remove_const_t<char> *local_38;
  
  local_44 = CONCAT31(in_register_00000089,showbase);
  local_40 = first;
  local_38 = last;
  if (first < last) {
    do {
      if (local_40 < first && filler != '\0') {
        local_45 = filler;
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_45,1);
      }
      val = *first;
      poVar1 = os + *(long *)(*(long *)os + -0x18);
      if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar1);
        poVar1[0xe0] = oVar3;
        poVar1[0xe1] = (ostream)0x1;
      }
      poVar1[0xe0] = (ostream)0x30;
      if ((char)local_44 != '\0') {
        *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
             *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) | 0x200;
      }
      if (uppercasehex) {
        *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
             *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) | 0x4000;
      }
      uVar5 = 2;
      if ((numberbase == 2) || (numberbase == 8)) {
LAB_00128334:
        lVar2 = *(long *)os;
        *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = uVar5;
        lVar2 = *(long *)(lVar2 + -0x18);
        *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffffb5 | numberbase;
      }
      else if (numberbase == 0x40) {
        uVar5 = 3;
        goto LAB_00128334;
      }
      bVar4 = Hexdumper_base::getbin(os);
      if (bVar4) {
        if ((char)local_44 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(os,"0b",2);
        }
        *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 8;
        output_bin(os,val);
      }
      else {
        std::ostream::_M_insert<long_long>((longlong)os);
      }
      first = first + 1;
    } while (first != local_38);
  }
  return;
}

Assistant:

static void output_hex(std::ostream& os, const T*first, const T*last, char filler, int numberbase, bool showbase, bool uppercasehex)
    {
        const T* p = first;
        while (p < last)
        {
            if (filler && p > first)
                os << filler;
            auto val = *p;
            os << std::setfill('0');
            if (showbase)
                os << std::showbase;
            if (uppercasehex)
                os << std::uppercase;

            if (numberbase==os.hex) {
                os << std::setw(sizeof(T)*2);
                os << std::hex;
            }
            else if (numberbase==os.oct) {
                os << std::setw((sizeof(T)*8+2)/3);
                os << std::oct;
            }
            else if (numberbase==os.dec) {
                os << std::setw(sizeof(T)*2);
                os << std::dec;
            }

            if (getbin(os)) {
                if (showbase)
                    os << "0b";
                os << std::setw(sizeof(T)*8);
                output_bin(os, val);
            }
            else {
                output_hex_int(os, val);
            }

            ++p;
        }
    }